

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

shared_ptr<jessilib::parser> __thiscall jessilib::get_parser(jessilib *this,string *in_format)

{
  bool bVar1;
  parser_manager *in_format_00;
  format_not_available *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<jessilib::parser> sVar2;
  string *in_format_local;
  shared_ptr<jessilib::parser> *parser;
  
  in_format_00 = impl::parser_manager::instance();
  impl::parser_manager::find_parser((parser_manager *)this,(string *)in_format_00);
  bVar1 = std::operator==((shared_ptr<jessilib::parser> *)this,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = (format_not_available *)__cxa_allocate_exception(0x10);
    format_not_available::format_not_available(this_00,in_format);
    __cxa_throw(this_00,&format_not_available::typeinfo,format_not_available::~format_not_available)
    ;
  }
  sVar2.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<jessilib::parser>)
         sVar2.super___shared_ptr<jessilib::parser,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<parser> get_parser(const std::string& in_format) {
	auto parser = impl::parser_manager::instance().find_parser(in_format);
	if (parser == nullptr) {
		throw format_not_available{ in_format };
	}

	return parser;
}